

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

Vec_Ptr_t * Abc_NodeGetFaninNames(Abc_Obj_t *pNode)

{
  long lVar1;
  long *plVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  char *__s;
  size_t sVar5;
  char *__dest;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  if (0 < (pNode->vFanins).nSize) {
    uVar7 = 100;
    lVar8 = 0;
    do {
      plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
      __s = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2]);
      if (__s == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar5 = strlen(__s);
        __dest = (char *)malloc(sVar5 + 1);
        strcpy(__dest,__s);
      }
      iVar6 = (int)uVar7;
      if ((int)lVar8 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,uVar7 * 8);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      lVar1 = lVar8 + 1;
      pVVar3->nSize = (int)lVar1;
      ppvVar4[lVar8] = __dest;
      lVar8 = lVar1;
    } while (lVar1 < (pNode->vFanins).nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Abc_NodeGetFaninNames( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pFanin;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Vec_PtrPush( vNodes, Abc_UtilStrsav(Abc_ObjName(pFanin)) );
    return vNodes;
}